

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

int __thiscall Fl_Browser_::deselect(Fl_Browser_ *this,int docallbacks)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  fd_set *in_R8;
  timeval *in_R9;
  long local_28;
  void *p;
  int change;
  int docallbacks_local;
  Fl_Browser_ *this_local;
  
  uVar1 = Fl_Widget::type((Fl_Widget *)this);
  if (uVar1 == '\x03') {
    p._0_4_ = 0;
    iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
    local_28 = CONCAT44(extraout_var,iVar2);
    while (local_28 != 0) {
      uVar3 = select(this,(int)local_28,(fd_set *)0x0,(fd_set *)(ulong)(uint)docallbacks,in_R8,in_R9
                    );
      p._0_4_ = uVar3 | (uint)p;
      iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_28);
      local_28 = CONCAT44(extraout_var_00,iVar2);
    }
    this_local._4_4_ = (uint)p;
  }
  else if (this->selection_ == (void *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x18])(this,this->selection_,0);
    redraw_line(this,this->selection_);
    this->selection_ = (void *)0x0;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Browser_::deselect(int docallbacks) {
  if (type() == FL_MULTI_BROWSER) {
    int change = 0;
    for (void* p = item_first(); p; p = item_next(p))
      change |= select(p, 0, docallbacks);
    return change;
  } else {
    if (!selection_) return 0;
    item_select(selection_, 0);
    redraw_line(selection_);
    selection_ = 0;
    return 1;
  }
}